

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::WhileStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQUnsignedInteger SVar2;
  SQFuncState *pSVar3;
  SQUnsignedInteger SVar4;
  SQUnsignedInteger SVar5;
  ulong uVar6;
  ulong uVar7;
  SQUnsignedInteger SVar8;
  SQInteger SVar9;
  longlong *plVar10;
  long lVar11;
  SQUnsignedInteger SVar12;
  long targetpos;
  long lVar13;
  SQScope __oldscope__;
  SQInstruction local_50;
  SQInstruction local_48;
  SQInteger SStack_40;
  
  SVar2 = (this->_fs->_instructions)._size;
  SVar9 = SQLexer::Lex(&this->_lex);
  this->_token = SVar9;
  Expect(this,0x28);
  CommaExpr(this);
  Expect(this,0x29);
  pSVar3 = this->_fs;
  SVar4 = (pSVar3->_unresolvedbreaks)._size;
  SVar5 = (pSVar3->_unresolvedcontinues)._size;
  uVar6 = (pSVar3->_breaktargets)._allocated;
  uVar7 = (pSVar3->_breaktargets)._size;
  if (uVar6 <= uVar7) {
    SVar8 = uVar7 * 2;
    SVar12 = 4;
    if (SVar8 != 0) {
      SVar12 = SVar8;
    }
    plVar10 = (longlong *)sq_vm_realloc((pSVar3->_breaktargets)._vals,uVar6 << 3,SVar12 * 8);
    (pSVar3->_breaktargets)._vals = plVar10;
    (pSVar3->_breaktargets)._allocated = SVar12;
  }
  SVar8 = (pSVar3->_breaktargets)._size;
  (pSVar3->_breaktargets)._size = SVar8 + 1;
  (pSVar3->_breaktargets)._vals[SVar8] = 0;
  pSVar3 = this->_fs;
  uVar6 = (pSVar3->_continuetargets)._size;
  uVar7 = (pSVar3->_continuetargets)._allocated;
  if (uVar7 <= uVar6) {
    SVar8 = uVar6 * 2;
    SVar12 = 4;
    if (SVar8 != 0) {
      SVar12 = SVar8;
    }
    plVar10 = (longlong *)sq_vm_realloc((pSVar3->_continuetargets)._vals,uVar7 << 3,SVar12 * 8);
    (pSVar3->_continuetargets)._vals = plVar10;
    (pSVar3->_continuetargets)._allocated = SVar12;
  }
  targetpos = SVar2 - 1;
  SVar2 = (pSVar3->_continuetargets)._size;
  (pSVar3->_continuetargets)._size = SVar2 + 1;
  (pSVar3->_continuetargets)._vals[SVar2] = 0;
  pSVar3 = this->_fs;
  SVar9 = SQFuncState::PopTarget(pSVar3);
  local_48._arg0 = (uchar)SVar9;
  local_48._0_5_ = 0x1e00000000;
  local_48 = (SQInstruction)((ulong)local_48._4_2_ << 0x20);
  SQFuncState::AddInstruction(pSVar3,&local_48);
  pSVar3 = this->_fs;
  SVar2 = (pSVar3->_instructions)._size;
  local_48 = (SQInstruction)(this->_scope).outers;
  SStack_40 = (this->_scope).stacksize;
  (this->_scope).outers = pSVar3->_outers;
  SVar9 = SQFuncState::GetStackSize(pSVar3);
  (this->_scope).stacksize = SVar9;
  Statement(this,true);
  lVar11 = this->_fs->_outers;
  SVar9 = SQFuncState::GetStackSize(this->_fs);
  lVar13 = (this->_scope).stacksize;
  if (SVar9 != lVar13) {
    SQFuncState::SetStackSize(this->_fs,lVar13);
    if (lVar11 != this->_fs->_outers) {
      local_50._arg1 = (SQInt32)(this->_scope).stacksize;
      local_50.op = '<';
      local_50._arg0 = '\0';
      local_50._arg2 = '\0';
      local_50._arg3 = '\0';
      SQFuncState::AddInstruction(this->_fs,&local_50);
    }
  }
  (this->_scope).outers = (SQInteger)local_48;
  (this->_scope).stacksize = SStack_40;
  local_50._arg1 = (int)targetpos - (int)(this->_fs->_instructions)._size;
  local_50.op = '\x1c';
  local_50._arg0 = '\0';
  local_50._arg2 = '\0';
  local_50._arg3 = '\0';
  SQFuncState::AddInstruction(this->_fs,&local_50);
  SQFuncState::SetInstructionParam(this->_fs,SVar2 - 1,1,(this->_fs->_instructions)._size - SVar2);
  pSVar3 = this->_fs;
  lVar13 = (pSVar3->_unresolvedbreaks)._size - SVar4;
  lVar11 = (pSVar3->_unresolvedcontinues)._size - SVar5;
  if (0 < lVar11) {
    ResolveContinues(this,pSVar3,lVar11,targetpos);
  }
  if (0 < lVar13) {
    ResolveBreaks(this,this->_fs,lVar13);
  }
  pSVar3 = this->_fs;
  pSVar1 = &(pSVar3->_breaktargets)._size;
  *pSVar1 = *pSVar1 - 1;
  pSVar1 = &(pSVar3->_continuetargets)._size;
  *pSVar1 = *pSVar1 - 1;
  return;
}

Assistant:

void WhileStatement()
    {
        SQInteger jzpos, jmppos;
        jmppos = _fs->GetCurrentPos();
        Lex(); Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));

        BEGIN_BREAKBLE_BLOCK();
        _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
        jzpos = _fs->GetCurrentPos();
        BEGIN_SCOPE();

        Statement();

        END_SCOPE();
        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1);
        _fs->SetInstructionParam(jzpos, 1, _fs->GetCurrentPos() - jzpos);

        END_BREAKBLE_BLOCK(jmppos);
    }